

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::GLMClassifier::GLMClassifier(GLMClassifier *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__GLMClassifier_00409f18;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->weights_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->weights_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->weights_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->weights_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->offset_).current_size_ = 0;
  (this->offset_).total_size_ = 0;
  (this->offset_).rep_ = (Rep *)0x0;
  if (this != (GLMClassifier *)&_GLMClassifier_default_instance_) {
    protobuf_GLMClassifier_2eproto::InitDefaults();
  }
  this->postevaluationtransform_ = 0;
  this->classencoding_ = 0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

GLMClassifier::GLMClassifier()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_GLMClassifier_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.GLMClassifier)
}